

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

int lws_h2_client_handshake(lws *wsi)

{
  char cVar1;
  lws_context *plVar2;
  int iVar3;
  uchar *puVar4;
  lws *plVar5;
  char *pcVar6;
  size_t sVar7;
  uchar *puVar8;
  uint8_t *puVar9;
  lws_write_protocol wp;
  uint uVar10;
  uchar *puVar11;
  uint8_t *p;
  uint8_t *local_48;
  uchar *local_40;
  lws_context *local_38;
  
  local_38 = (wsi->a).context;
  cVar1 = wsi->tsi;
  puVar4 = (uchar *)lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_METHOD);
  local_40 = (uchar *)lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_URI);
  plVar5 = lws_get_network_wsi(wsi);
  uVar10 = ((plVar5->h2).h2n)->highest_sid_opened + 2;
  _lws_log(0x10,"%s\n","lws_h2_client_handshake");
  ((plVar5->h2).h2n)->highest_sid_opened = uVar10;
  (wsi->mux).my_sid = uVar10;
  pcVar6 = lws_wsi_tag(wsi);
  _lws_log(8,"%s: %s: assigning SID %d at header send\n","lws_h2_client_handshake",pcVar6,
           (ulong)uVar10);
  _lws_log(8,"%s: CLIENT_WAITING_TO_SEND_HEADERS: pollout (sid %d)\n","lws_h2_client_handshake",
           (ulong)(wsi->mux).my_sid);
  puVar11 = local_38->pt[cVar1].serv_buf;
  local_48 = puVar11 + 0x10;
  puVar11 = puVar11 + ((ulong)(((wsi->a).context)->pt_serv_buf_size >> 1) - 1);
  puVar8 = (uchar *)"GET";
  if (puVar4 != (uchar *)0x0) {
    puVar8 = puVar4;
  }
  local_38 = (lws_context *)local_48;
  sVar7 = strlen((char *)puVar8);
  iVar3 = lws_add_http_header_by_token
                    (wsi,WSI_TOKEN_HTTP_COLON_METHOD,puVar8,(int)sVar7,&local_48,puVar11);
  if ((iVar3 == 0) &&
     (iVar3 = lws_add_http_header_by_token
                        (wsi,WSI_TOKEN_HTTP_COLON_SCHEME,"https",5,&local_48,puVar11), iVar3 == 0))
  {
    iVar3 = lws_hdr_total_length(wsi,_WSI_TOKEN_CLIENT_URI);
    if (iVar3 == 0) {
      iVar3 = 1;
      local_40 = "/";
      if ((wsi->stash != (client_info_stash *)0x0) &&
         (puVar8 = (uchar *)wsi->stash->cis[1], puVar8 != (uchar *)0x0)) {
        sVar7 = strlen((char *)puVar8);
        iVar3 = (int)sVar7;
        local_40 = puVar8;
      }
    }
    if ((1 < iVar3) && (*local_40 == '/')) {
      puVar8 = local_40 + 1;
      if (*puVar8 == '/') {
        local_40 = local_40 + 1;
      }
      iVar3 = iVar3 - (uint)(*puVar8 == '/');
    }
    if ((iVar3 == 0) ||
       (iVar3 = lws_add_http_header_by_token
                          (wsi,WSI_TOKEN_HTTP_COLON_PATH,local_40,iVar3,&local_48,puVar11),
       iVar3 == 0)) {
      iVar3 = lws_hdr_total_length(wsi,_WSI_TOKEN_CLIENT_HOST);
      puVar8 = (uchar *)lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_HOST);
      if (iVar3 == 0) {
        iVar3 = 0;
        if ((wsi->stash != (client_info_stash *)0x0) &&
           (puVar4 = (uchar *)wsi->stash->cis[0], puVar4 != (uchar *)0x0)) {
          sVar7 = strlen((char *)puVar4);
          iVar3 = (int)sVar7;
          puVar8 = puVar4;
        }
      }
      if (((puVar8 == (uchar *)0x0 || iVar3 == 0) ||
          (iVar3 = lws_add_http_header_by_token(wsi,WSI_TOKEN_HOST,puVar8,iVar3,&local_48,puVar11),
          iVar3 == 0)) &&
         ((puVar9 = local_48, (wsi->flags & 0x400) == 0 ||
          (puVar9 = lws_http_multipart_headers(wsi,local_48), puVar9 != (uint8_t *)0x0)))) {
        local_48 = puVar9;
        if ((wsi->flags & 0x800) != 0) {
          iVar3 = lws_add_http_header_by_token
                            (wsi,WSI_TOKEN_HTTP_CONTENT_TYPE,
                             (uchar *)"application/x-www-form-urlencoded",0x21,&local_48,puVar11);
          if (iVar3 != 0) goto LAB_0013c44a;
          lws_client_http_body_pending(wsi,1);
        }
        if ((wsi->flags & 0x40000000) != 0) {
          lws_cookie_send_cookies(wsi,(char **)&local_48,(char *)puVar11);
        }
        iVar3 = (*((wsi->a).protocol)->callback)
                          (wsi,LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER,wsi->user_space,&local_48
                           ,(size_t)(puVar11 + (-0xc - (long)local_48)));
        if ((iVar3 == 0) &&
           (iVar3 = lws_finalize_http_header(wsi,&local_48,puVar11), plVar2 = local_38, iVar3 == 0))
        {
          wp = LWS_WRITE_HTTP_HEADERS;
          if (((wsi->flags & 0x20) != 0) && ((wsi->field_0x474 & 0x10) == 0)) {
            wp = (uint)(wsi->buflist_out == (lws_buflist *)0x0) << 7 | LWS_WRITE_HTTP_HEADERS;
          }
          uVar10 = lws_write(wsi,(uchar *)local_38,(long)local_48 - (long)local_38,wp);
          if (uVar10 != (int)local_48 - (int)plVar2) {
            _lws_log(1,"_write returned %d from %ld\n",(ulong)uVar10);
            return -1;
          }
          iVar3 = 0x40000;
          if ((wsi->flags & 0x200) != 0) {
            iVar3 = (wsi->txc).manual_initial_tx_credit;
            (wsi->txc).manual = '\x01';
          }
          iVar3 = lws_h2_update_peer_txcredit(wsi,(wsi->mux).my_sid,iVar3);
          if (iVar3 == 0) {
            lws_h2_state(wsi,LWS_H2_STATE_OPEN);
            lwsi_set_state(wsi,0x119);
            if ((wsi->flags & 0x400) != 0) {
              lws_callback_on_writable(wsi);
              return 0;
            }
            return 0;
          }
          return 1;
        }
      }
    }
  }
LAB_0013c44a:
  _lws_log(1,"Client hdrs too long: incr context info.pt_serv_buf_size\n");
  return -1;
}

Assistant:

int
lws_h2_client_handshake(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];
	uint8_t *buf, *start, *p, *p1, *end;
	char *meth = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_METHOD),
	     *uri = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_URI), *simp;
	struct lws *nwsi = lws_get_network_wsi(wsi);
	const char *path = "/";
	int n, m;
	/*
	 * The identifier of a newly established stream MUST be numerically
	 * greater than all streams that the initiating endpoint has opened or
	 * reserved.  This governs streams that are opened using a HEADERS frame
	 * and streams that are reserved using PUSH_PROMISE.  An endpoint that
	 * receives an unexpected stream identifier MUST respond with a
	 * connection error (Section 5.4.1) of type PROTOCOL_ERROR.
	 */
	unsigned int sid = nwsi->h2.h2n->highest_sid_opened + 2;

	lwsl_debug("%s\n", __func__);

	/*
	 * We MUST allocate our sid here at the point we're about to send the
	 * stream open.  It's because we don't know the order in which multiple
	 * open streams will send their headers... in h2, sending the headers
	 * is the point the stream is opened.  The peer requires that we only
	 * open streams in ascending sid order
	 */

	wsi->mux.my_sid = nwsi->h2.h2n->highest_sid_opened = sid;
	lwsl_info("%s: %s: assigning SID %d at header send\n", __func__,
			lws_wsi_tag(wsi), sid);


	lwsl_info("%s: CLIENT_WAITING_TO_SEND_HEADERS: pollout (sid %d)\n",
			__func__, wsi->mux.my_sid);

	p = start = buf = pt->serv_buf + LWS_PRE;
	end = start + (wsi->a.context->pt_serv_buf_size / 2) - LWS_PRE - 1;

	/* it's time for us to send our client stream headers */

	if (!meth)
		meth = "GET";

	/* h2 pseudoheaders must be in a bunch at the start */

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_METHOD,
				(unsigned char *)meth,
				(int)strlen(meth), &p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_SCHEME,
				(unsigned char *)"https", 5,
				&p, end))
		goto fail_length;


	n = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI);
	if (n)
		path = uri;
	else
		if (wsi->stash && wsi->stash->cis[CIS_PATH]) {
			path = wsi->stash->cis[CIS_PATH];
			n = (int)strlen(path);
		} else
			n = 1;

	if (n > 1 && path[0] == '/' && path[1] == '/') {
		path++;
		n--;
	}

	if (n && lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_PATH,
				(unsigned char *)path, n, &p, end))
		goto fail_length;

	n = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_HOST);
	simp = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_HOST);
	if (!n && wsi->stash && wsi->stash->cis[CIS_ADDRESS]) {
		n = (int)strlen(wsi->stash->cis[CIS_ADDRESS]);
		simp = wsi->stash->cis[CIS_ADDRESS];
	}

//	n = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_ORIGIN);
//	simp = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_ORIGIN);
#if 0
	if (n && simp && lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_AUTHORITY,
				(unsigned char *)simp, n, &p, end))
		goto fail_length;
#endif


	if (/*!wsi->client_h2_alpn && */n && simp &&
	    lws_add_http_header_by_token(wsi, WSI_TOKEN_HOST,
				(unsigned char *)simp, n, &p, end))
		goto fail_length;


	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME) {
		p1 = lws_http_multipart_headers(wsi, p);
		if (!p1)
			goto fail_length;
		p = p1;
	}

	if (wsi->flags & LCCSCF_HTTP_X_WWW_FORM_URLENCODED) {
		if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE,
			   (unsigned char *)"application/x-www-form-urlencoded",
			   33, &p, end))
			goto fail_length;
		lws_client_http_body_pending(wsi, 1);
	}

	/* give userland a chance to append, eg, cookies */

#if defined(LWS_WITH_CACHE_NSCOOKIEJAR) && defined(LWS_WITH_CLIENT)
	if (wsi->flags & LCCSCF_CACHE_COOKIES)
		lws_cookie_send_cookies(wsi, (char **)&p, (char *)end);
#endif

	if (wsi->a.protocol->callback(wsi,
				LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER,
				wsi->user_space, &p, lws_ptr_diff_size_t(end, p) - 12))
		goto fail_length;

	if (lws_finalize_http_header(wsi, &p, end))
		goto fail_length;

	m = LWS_WRITE_HTTP_HEADERS;
#if defined(LWS_WITH_CLIENT)
	/* below is not needed in spec, indeed it destroys the long poll
	 * feature, but required by nghttp2 */
	if ((wsi->flags & LCCSCF_H2_QUIRK_NGHTTP2_END_STREAM) &&
	    !(wsi->client_http_body_pending  || lws_has_buffered_out(wsi)))
		m |= LWS_WRITE_H2_STREAM_END;
#endif

	// lwsl_hexdump_notice(start, p - start);

	n = lws_write(wsi, start, lws_ptr_diff_size_t(p, start), (enum lws_write_protocol)m);

	if (n != lws_ptr_diff(p, start)) {
		lwsl_err("_write returned %d from %ld\n", n,
			 (long)(p - start));
		return -1;
	}

	/*
	 * Normally let's charge up the peer tx credit a bit.  But if
	 * MANUAL_REFLOW is set, just set it to the initial credit given in
	 * the client create info
	 */

	n = 4 * 65536;
	if (wsi->flags & LCCSCF_H2_MANUAL_RXFLOW) {
		n = wsi->txc.manual_initial_tx_credit;
		wsi->txc.manual = 1;
	}

	if (lws_h2_update_peer_txcredit(wsi, wsi->mux.my_sid, n))
		return 1;

	lws_h2_state(wsi, LWS_H2_STATE_OPEN);
	lwsi_set_state(wsi, LRS_ESTABLISHED);

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME)
		lws_callback_on_writable(wsi);

	return 0;

fail_length:
	lwsl_err("Client hdrs too long: incr context info.pt_serv_buf_size\n");

	return -1;
}